

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O1

int __thiscall Fl_Shared_Image::copy(Fl_Shared_Image *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  char *__s;
  int iVar1;
  undefined4 extraout_var;
  Fl_Image *this_00;
  size_t sVar3;
  _func_int **__dest;
  long lVar2;
  
  if (this->image_ == (Fl_Image *)0x0) {
    lVar2 = 0;
  }
  else {
    iVar1 = (*this->image_->_vptr_Fl_Image[2])();
    lVar2 = CONCAT44(extraout_var,iVar1);
  }
  this_00 = (Fl_Image *)operator_new(0x48);
  Fl_Image::Fl_Image(this_00,0,0,0);
  this_00->_vptr_Fl_Image = (_func_int **)&PTR__Fl_Shared_Image_00279130;
  this_00[1]._vptr_Fl_Image = (_func_int **)0x0;
  this_00[1].w_ = 0;
  this_00[1].h_ = 1;
  this_00[1].d_ = 0;
  this_00[1].ld_ = 0;
  this_00[1].count_ = 0;
  __s = this->name_;
  sVar3 = strlen(__s);
  __dest = (_func_int **)operator_new__(sVar3 + 1);
  this_00[1]._vptr_Fl_Image = __dest;
  strcpy((char *)__dest,__s);
  this_00[1].h_ = 1;
  this_00[1].d_ = (int)lVar2;
  this_00[1].ld_ = (int)((ulong)lVar2 >> 0x20);
  this_00[1].count_ = 1;
  if (lVar2 != 0) {
    this_00->w_ = *(int *)(lVar2 + 8);
    this_00->h_ = *(int *)(lVar2 + 0xc);
    this_00->d_ = *(int *)(lVar2 + 0x10);
    iVar1 = *(int *)(lVar2 + 0x18);
    this_00->data_ = *(char ***)(lVar2 + 0x20);
    this_00->count_ = iVar1;
  }
  return (int)this_00;
}

Assistant:

Fl_Image *
Fl_Shared_Image::copy(int W, int H) {
  Fl_Image		*temp_image;	// New image file
  Fl_Shared_Image	*temp_shared;	// New shared image

  // Make a copy of the image we're sharing...
  if (!image_) temp_image = 0;
  else temp_image = image_->copy(W, H);

  // Then make a new shared image...
  temp_shared = new Fl_Shared_Image();

  temp_shared->name_ = new char[strlen(name_) + 1];
  strcpy((char *)temp_shared->name_, name_);

  temp_shared->refcount_    = 1;
  temp_shared->image_       = temp_image;
  temp_shared->alloc_image_ = 1;

  temp_shared->update();

  return temp_shared;
}